

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

TGet * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetTGet
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  bool bVar1;
  TGet_TransitionModelMappingSparse *this_00;
  
  if (this->_m_cached_FlatTM == true) {
    bVar1 = this->_m_sparse_FlatTM;
    this_00 = (TGet_TransitionModelMappingSparse *)operator_new(0x20);
    if (bVar1 == true) {
      TGet_TransitionModelMappingSparse::TGet_TransitionModelMappingSparse
                (this_00,(TransitionModelMappingSparse *)this->_m_p_tModel);
    }
    else {
      TGet_TransitionModelMapping::TGet_TransitionModelMapping
                ((TGet_TransitionModelMapping *)this_00,(TransitionModelMapping *)this->_m_p_tModel)
      ;
    }
  }
  else {
    this_00 = (TGet_TransitionModelMappingSparse *)0x0;
  }
  return &this_00->super_TGet;
}

Assistant:

TGet* MultiAgentDecisionProcessDiscreteFactoredStates::
GetTGet() const
{    
    if(!_m_cached_FlatTM)
        return 0;

    if(_m_sparse_FlatTM)
        return new TGet_TransitionModelMappingSparse(
                ((TransitionModelMappingSparse*)_m_p_tModel)  ); 
    else
        return new TGet_TransitionModelMapping(
                ((TransitionModelMapping*)_m_p_tModel)  );


}